

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_out_prod(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  ggml_tensor *pgVar1;
  char *pcVar2;
  int line;
  int64_t ne [4];
  
  if (((a->ne[1] == b->ne[1]) && (ne[2] = b->ne[2], ne[2] % a->ne[2] == 0)) &&
     (ne[3] = b->ne[3], ne[3] % a->ne[3] == 0)) {
    if (a->nb[0] <= a->nb[1]) {
      ne[0] = a->ne[0];
      ne[1] = b->ne[0];
      pgVar1 = ggml_new_tensor(ctx,GGML_TYPE_F32,4,ne);
      pgVar1->op = GGML_OP_OUT_PROD;
      pgVar1->src[0] = a;
      pgVar1->src[1] = b;
      return pgVar1;
    }
    pcVar2 = "!ggml_is_transposed(a)";
    line = 0xb05;
  }
  else {
    pcVar2 = "ggml_can_out_prod(a, b)";
    line = 0xb04;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             line,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

struct ggml_tensor * ggml_out_prod(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b) {
    GGML_ASSERT(ggml_can_out_prod(a, b));
    GGML_ASSERT(!ggml_is_transposed(a));

    // a is broadcastable to b for ne[2] and ne[3] -> use b->ne[2] and b->ne[3]
    const int64_t ne[4] = { a->ne[0], b->ne[0], b->ne[2], b->ne[3] };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    result->op     = GGML_OP_OUT_PROD;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}